

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

int __thiscall
boost::runtime::cla::parser::parse(parser *this,int argc,char **argv,arguments_store *res)

{
  size_t sVar1;
  iterator pvVar2;
  long lVar3;
  bool bVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  const_iterator cVar7;
  size_type sVar8;
  char *end;
  char *pcVar9;
  char *beg;
  iterator pvVar10;
  long lVar11;
  char *beg_1;
  parser *this_00;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  bool negative_form;
  argv_traverser tr;
  basic_param_ptr found_param;
  locate_result locate_res;
  cstring name;
  cstring prefix;
  trie_ptr curr_trie;
  cstring value_separator;
  bool local_2d1;
  argv_traverser local_2d0;
  basic_cstring<const_char> local_2b0;
  element_type *local_2a0;
  shared_count local_298;
  _Base_ptr local_290;
  str_to_trie *local_288;
  parser *local_280;
  _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
  *local_278;
  locate_result local_270;
  cstring local_1f8;
  key_type local_1e0;
  trie_ptr local_1d0;
  element_type *local_1c0;
  shared_count local_1b8;
  cstring local_1b0;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_1a0;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_168;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_130;
  duplicate_arg local_f8;
  char *local_c0;
  char *local_b8;
  key_type local_b0;
  cstring local_a0;
  cstring local_90;
  undefined **local_80;
  pointer local_78;
  pointer local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  cstring local_48;
  
  pcVar9 = *argv;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "";
    lVar11 = 0;
  }
  else {
    lVar11 = -1;
    do {
      lVar3 = lVar11 + 1;
      lVar11 = lVar11 + 1;
    } while (pcVar9[lVar3] != '\0');
  }
  pcVar13 = pcVar9 + lVar11;
  (this->m_program_name).m_begin = pcVar9;
  (this->m_program_name).m_end = pcVar13;
  local_290 = (_Base_ptr)CONCAT44(local_290._4_4_,argc);
  pcVar12 = pcVar13;
  local_288 = (str_to_trie *)argv;
  local_280 = this;
  local_278 = (_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
               *)res;
  if (lVar11 != 0) {
    do {
      lVar11 = lVar11 + -1;
      if (lVar11 == 0) {
        pcVar5 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           ("\\/","",pcVar9);
        pcVar12 = pcVar13;
        if (pcVar5 != "") {
          pcVar12 = pcVar9;
        }
        break;
      }
      pcVar12 = pcVar12 + -1;
      pcVar5 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         ("\\/","",pcVar12);
    } while (pcVar5 == "");
  }
  this_00 = local_280;
  pcVar9 = (local_280->m_program_name).m_end;
  if (pcVar12 != pcVar9) {
    pcVar13 = pcVar12 + 1;
    if (pcVar9 <= pcVar12 + 1) {
      pcVar13 = pcVar9;
    }
    (local_280->m_program_name).m_begin = pcVar13;
  }
  local_2d0.m_argc = (size_t)(int)local_290;
  local_2d0.m_token_size = 0;
  local_2d0.m_argv = (argv_type)local_288;
  local_2d0.m_curr_token = 1;
  if ((int)local_290 != 1) {
    local_2d0.m_token_size = strlen(*(char **)((long)local_288 + 8));
  }
  local_288 = &this_00->m_param_trie;
  local_290 = &(((storage_type *)&local_278->_M_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header
  ;
  do {
    sVar1 = local_2d0.m_token_size;
    if (local_2d0.m_curr_token == local_2d0.m_argc) break;
    pcVar13 = local_2d0.m_argv[local_2d0.m_curr_token];
    pcVar9 = pcVar13 + local_2d0.m_token_size;
    local_1e0.m_begin = "";
    local_1e0.m_end = "";
    local_1f8.m_begin = "";
    local_1f8.m_end = "";
    local_1b0.m_begin = "";
    local_1b0.m_end = "";
    local_2d1 = false;
    local_90.m_begin = pcVar13;
    local_90.m_end = pcVar9;
    bVar4 = validate_token_format(this_00,&local_90,&local_1e0,&local_1f8,&local_1b0,&local_2d1);
    if (bVar4) {
      pmVar6 = std::
               map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
               ::operator[](local_288,&local_1e0);
      local_1c0 = pmVar6->px;
      local_1b8.pi_ = (pmVar6->pn).pi_;
      if (local_1b8.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1b8.pi_)->use_count_ = (local_1b8.pi_)->use_count_ + 1;
        UNLOCK();
      }
      if (local_1c0 == (element_type *)0x0) {
        pvVar10 = (this_00->m_program_name).m_begin;
        pvVar2 = (this_00->m_program_name).m_end;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Boost.Test WARNING: token \"",0x1b);
        local_270.first.m_prefix._M_dataplus._M_p = (pointer)&local_270.first.m_prefix.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,pcVar13,pcVar13 + sVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,local_270.first.m_prefix._M_dataplus._M_p,
                   local_270.first.m_prefix._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270.first.m_prefix._M_dataplus._M_p != &local_270.first.m_prefix.field_2) {
          operator_delete(local_270.first.m_prefix._M_dataplus._M_p,
                          local_270.first.m_prefix.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\" does not correspond to the Boost.Test argument \n",0x32
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "                    and should be placed after all Boost.Test arguments and the -- separator.\n"
                   ,0x5e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"                    For example: ",0x21);
        local_270.first.m_prefix._M_dataplus._M_p = (pointer)&local_270.first.m_prefix.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,pvVar10,pvVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,local_270.first.m_prefix._M_dataplus._M_p,
                   local_270.first.m_prefix._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270.first.m_prefix._M_dataplus._M_p != &local_270.first.m_prefix.field_2) {
          operator_delete(local_270.first.m_prefix._M_dataplus._M_p,
                          local_270.first.m_prefix.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," --random -- ",0xd);
        local_270.first.m_prefix._M_dataplus._M_p = (pointer)&local_270.first.m_prefix.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,pcVar13,pcVar13 + sVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,local_270.first.m_prefix._M_dataplus._M_p,
                   local_270.first.m_prefix._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270.first.m_prefix._M_dataplus._M_p != &local_270.first.m_prefix.field_2) {
          operator_delete(local_270.first.m_prefix._M_dataplus._M_p,
                          local_270.first.m_prefix.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        this_00 = local_280;
        sVar1 = local_2d0.m_curr_token + 1;
        if (sVar1 != local_2d0.m_argc) {
          lVar11 = local_2d0.m_curr_token + 1;
          local_2d0.m_curr_token = sVar1;
          local_2d0.m_token_size = strlen(local_2d0.m_argv[lVar11]);
          sVar1 = local_2d0.m_curr_token;
        }
      }
      else {
        pcVar12 = pcVar13 + ((long)local_1e0.m_end - (long)local_1e0.m_begin);
        if (pcVar9 <= pcVar13 + ((long)local_1e0.m_end - (long)local_1e0.m_begin)) {
          pcVar12 = pcVar9;
        }
        if (local_1b8.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_1b8.pi_)->use_count_ = (local_1b8.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_48.m_begin = local_1f8.m_begin;
        local_48.m_end = local_1f8.m_end;
        local_1d0.px = local_1c0;
        local_1d0.pn.pi_ = local_1b8.pi_;
        local_a0.m_begin = pcVar12;
        local_a0.m_end = pcVar9;
        locate_parameter(&local_270,this_00,&local_1d0,&local_48,&local_a0);
        detail::shared_count::~shared_count(&local_1d0.pn);
        local_2a0 = local_270.second.px;
        local_298.pi_ = local_270.second.pn.pi_;
        if (local_270.second.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_270.second.pn.pi_)->use_count_ = (local_270.second.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        pcVar13 = pcVar12;
        if (local_2d1 == true) {
          if (local_270.first.m_negatable == false) {
            if (local_270.second.px != (element_type *)0x0) {
              local_1a0.super_input_error.super_param_error.param_name.m_begin =
                   ((local_270.second.px)->p_name)._M_dataplus._M_p;
              local_1a0.super_input_error.super_param_error.param_name.m_end =
                   local_1a0.super_input_error.super_param_error.param_name.m_begin +
                   ((local_270.second.px)->p_name)._M_string_length;
              local_1a0.super_input_error.super_param_error.msg._M_dataplus._M_p =
                   (pointer)&local_1a0.super_input_error.super_param_error.msg.field_2;
              local_1a0.super_input_error.super_param_error.msg._M_string_length = 0;
              local_1a0.super_input_error.super_param_error.msg.field_2._M_local_buf[0] = '\0';
              local_1a0.super_input_error.super_param_error._0_8_ = &PTR__param_error_001cc128;
              specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
              operator<<((format_error *)&local_168,&local_1a0,"Parameter tag ");
              specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
              operator<<((format_error *)&local_130,
                         (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                          *)&local_168,&local_270.first.m_tag);
              specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
              operator<<((format_error *)&local_f8,&local_130," is not negatable.");
              unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                        ((format_error *)&local_f8);
            }
            goto LAB_0017ed7e;
          }
          pcVar13 = pcVar12 + (this_00->m_negation_prefix)._M_string_length;
          if (pcVar9 <= pcVar12 + (this_00->m_negation_prefix)._M_string_length) {
            pcVar13 = pcVar9;
          }
        }
        pcVar12 = pcVar13 + ((long)local_1f8.m_end - (long)local_1f8.m_begin);
        if (pcVar9 <= pcVar13 + ((long)local_1f8.m_end - (long)local_1f8.m_begin)) {
          pcVar12 = pcVar9;
        }
        sVar8 = (long)local_1b0.m_end - (long)local_1b0.m_begin;
        if (sVar8 == 0) {
          if (local_270.second.px == (element_type *)0x0) goto LAB_0017ed7e;
          pcVar13 = "";
          pcVar5 = "";
          if (((local_270.second.px)->p_has_optional_value).super_class_property<bool>.value ==
              false) goto LAB_0017e7bf;
        }
        else {
LAB_0017e7bf:
          if (sVar8 != local_270.first.m_value_separator._M_string_length) {
LAB_0017eb47:
            if (local_270.second.px != (element_type *)0x0) {
              local_78 = ((local_270.second.px)->p_name)._M_dataplus._M_p;
              local_70 = local_78 + ((local_270.second.px)->p_name)._M_string_length;
              local_68._M_p = (pointer)&local_58;
              local_60 = 0;
              local_58._M_local_buf[0] = '\0';
              local_80 = &PTR__param_error_001cc128;
              specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
              operator<<((format_error *)&local_1a0,
                         (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                          *)&local_80,"Invalid separator for the parameter ");
              if (local_2a0 != (element_type *)0x0) {
                specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                operator<<((format_error *)&local_168,
                           (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                            *)&local_1a0,&local_2a0->p_name);
                specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
                operator<<((format_error *)&local_130,&local_168," in the argument ");
                if (local_2d0.m_curr_token == local_2d0.m_argc) {
                  local_2b0.m_end = "";
                  local_2b0.m_begin = "";
                }
                else {
                  local_2b0.m_begin = local_2d0.m_argv[local_2d0.m_curr_token];
                  local_2b0.m_end = local_2b0.m_begin + local_2d0.m_token_size;
                }
                specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                operator<<((format_error *)&local_f8,
                           (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                            *)&local_130,&local_2b0);
                unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                          ((format_error *)&local_f8);
              }
            }
            goto LAB_0017ed7e;
          }
          if (sVar8 != 0) {
            pvVar10 = (iterator)0x0;
            do {
              pcVar13 = local_1b0.m_begin + (long)pvVar10;
              pcVar5 = local_270.first.m_value_separator._M_dataplus._M_p + (long)pvVar10;
              if (*pcVar13 != *pcVar5) break;
              bVar14 = local_1b0.m_end + ~(ulong)local_1b0.m_begin != pvVar10;
              pvVar10 = pvVar10 + 1;
            } while (bVar14);
            if (*pcVar13 != *pcVar5) goto LAB_0017eb47;
          }
          pcVar13 = pcVar12 + sVar8;
          if (pcVar9 <= pcVar13) {
            argv_traverser::next_token(&local_2d0);
            pcVar9 = "";
            pcVar13 = "";
            if (local_2d0.m_curr_token != local_2d0.m_argc) {
              pcVar13 = local_2d0.m_argv[local_2d0.m_curr_token];
              pcVar9 = pcVar13 + local_2d0.m_token_size;
            }
          }
          pcVar5 = pcVar9;
          if (pcVar9 == pcVar13) {
            if (local_2a0 != (element_type *)0x0) {
              local_78 = (local_2a0->p_name)._M_dataplus._M_p;
              local_70 = local_78 + (local_2a0->p_name)._M_string_length;
              local_68._M_p = (pointer)&local_58;
              local_60 = 0;
              local_58._M_local_buf[0] = '\0';
              local_80 = &PTR__param_error_001cc128;
              specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
              operator<<((format_error *)&local_1a0,
                         (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                          *)&local_80,"Missing an argument value for the parameter ");
              if (local_2a0 != (element_type *)0x0) {
                specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                operator<<((format_error *)&local_168,
                           (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                            *)&local_1a0,&local_2a0->p_name);
                specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
                operator<<((format_error *)&local_130,&local_168," in the argument ");
                if (local_2d0.m_curr_token == local_2d0.m_argc) {
                  local_2b0.m_end = "";
                  local_2b0.m_begin = "";
                }
                else {
                  local_2b0.m_begin = local_2d0.m_argv[local_2d0.m_curr_token];
                  local_2b0.m_end = local_2b0.m_begin + local_2d0.m_token_size;
                }
                specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                operator<<((format_error *)&local_f8,
                           (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                            *)&local_130,&local_2b0);
                unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                          ((format_error *)&local_f8);
              }
            }
            goto LAB_0017ed7e;
          }
        }
        if (local_2a0 == (element_type *)0x0) goto LAB_0017ed7e;
        local_b0.m_begin = (local_2a0->p_name)._M_dataplus._M_p;
        local_b0.m_end = local_b0.m_begin + (local_2a0->p_name)._M_string_length;
        cVar7 = std::
                _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
                ::find(local_278,&local_b0);
        if (cVar7._M_node != local_290) {
          if (local_2a0 == (element_type *)0x0) goto LAB_0017ed7e;
          if (local_2a0->p_repeatable == false) {
            local_78 = (local_2a0->p_name)._M_dataplus._M_p;
            local_70 = local_78 + (local_2a0->p_name)._M_string_length;
            local_68._M_p = (pointer)&local_58;
            local_60 = 0;
            local_58._M_local_buf[0] = '\0';
            local_80 = &PTR__param_error_001ccee0;
            specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>::
            operator<<((duplicate_arg *)&local_1a0,
                       (specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>
                        *)&local_80,"Duplicate argument value for the parameter ");
            if (local_2a0 != (element_type *)0x0) {
              specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>::
              operator<<((duplicate_arg *)&local_168,
                         (specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>
                          *)&local_1a0,&local_2a0->p_name);
              specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>::
              operator<<((duplicate_arg *)&local_130,
                         (specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>
                          *)&local_168," in the argument ");
              if (local_2d0.m_curr_token == local_2d0.m_argc) {
                local_2b0.m_end = "";
                local_2b0.m_begin = "";
              }
              else {
                local_2b0.m_begin = local_2d0.m_argv[local_2d0.m_curr_token];
                local_2b0.m_end = local_2b0.m_begin + local_2d0.m_token_size;
              }
              specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>::
              operator<<(&local_f8,
                         (specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>
                          *)&local_130,&local_2b0);
              unit_test::ut_detail::throw_exception<boost::runtime::duplicate_arg>(&local_f8);
            }
            goto LAB_0017ed7e;
          }
        }
        if (local_2a0 == (element_type *)0x0) {
LAB_0017ed7e:
          __assert_fail("px != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                        ,0x2de,
                        "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::basic_param>::operator->() const [T = boost::runtime::basic_param]"
                       );
        }
        local_c0 = pcVar13;
        local_b8 = pcVar5;
        (*local_2a0->_vptr_basic_param[3])(local_2a0,&local_c0,(ulong)local_2d1,local_278);
        argv_traverser::next_token(&local_2d0);
        detail::shared_count::~shared_count(&local_298);
        detail::shared_count::~shared_count(&local_270.second.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270.first.m_value_separator._M_dataplus._M_p !=
            &local_270.first.m_value_separator.field_2) {
          operator_delete(local_270.first.m_value_separator._M_dataplus._M_p,
                          local_270.first.m_value_separator.field_2._M_allocated_capacity + 1);
        }
        this_00 = local_280;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270.first.m_tag._M_dataplus._M_p != &local_270.first.m_tag.field_2) {
          operator_delete(local_270.first.m_tag._M_dataplus._M_p,
                          local_270.first.m_tag.field_2._M_allocated_capacity + 1);
        }
        sVar1 = local_2d0.m_curr_token;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270.first.m_prefix._M_dataplus._M_p != &local_270.first.m_prefix.field_2) {
          operator_delete(local_270.first.m_prefix._M_dataplus._M_p,
                          local_270.first.m_prefix.field_2._M_allocated_capacity + 1);
          sVar1 = local_2d0.m_curr_token;
        }
      }
      local_2d0.m_curr_token = sVar1;
      detail::shared_count::~shared_count(&local_1b8);
    }
    else {
      argv_traverser::next_token(&local_2d0);
    }
  } while (bVar4);
  return (int)local_2d0.m_argc;
}

Assistant:

int
    parse( int argc, char** argv, runtime::arguments_store& res )
    {
        // save program name for help message
        m_program_name = argv[0];
        cstring path_sep( "\\/" );

        cstring::iterator it = unit_test::utils::find_last_of( m_program_name.begin(), m_program_name.end(),
                                                                path_sep.begin(), path_sep.end() );
        if( it != m_program_name.end() )
            m_program_name.trim_left( it + 1 );

        // Set up the traverser
        argv_traverser tr( argc, (char const**)argv );

        // Loop till we reach end of input
        while( !tr.eoi() ) {
            cstring curr_token = tr.current_token();

            cstring prefix;
            cstring name;
            cstring value_separator;
            bool    negative_form = false;

            // Perform format validations and split the argument into prefix, name and separator
            // False return value indicates end of params indicator is met
            if( !validate_token_format( curr_token, prefix, name, value_separator, negative_form ) ) {
                // get rid of "end of params" token
                tr.next_token();
                break;
            }

            // Locate trie corresponding to found prefix and skip it in the input
            trie_ptr curr_trie = m_param_trie[prefix];

            if( !curr_trie ) {
                //  format_error() << "Unrecognized parameter prefix in the argument " << tr.current_token()
                rt_cla_detail::report_foreing_token( m_program_name, curr_token );
                tr.save_token();
                continue;
            }

            curr_token.trim_left( prefix.size() );

            // Locate parameter based on a name and skip it in the input
            locate_result locate_res = locate_parameter( curr_trie, name, curr_token );
            parameter_cla_id const& found_id    = locate_res.first;
            basic_param_ptr         found_param = locate_res.second;

            if( negative_form ) {
                BOOST_TEST_I_ASSRT( found_id.m_negatable,
                                    format_error( found_param->p_name ) 
                                        << "Parameter tag " << found_id.m_tag << " is not negatable." );

                curr_token.trim_left( m_negation_prefix.size() );
            }

            curr_token.trim_left( name.size() );

            cstring value;

            // Skip validations if parameter has optional value and we are at the end of token
            if( !value_separator.is_empty() || !found_param->p_has_optional_value ) {
                // Validate and skip value separator in the input
                BOOST_TEST_I_ASSRT( found_id.m_value_separator == value_separator,
                                    format_error( found_param->p_name ) 
                                        << "Invalid separator for the parameter "
                                        << found_param->p_name
                                        << " in the argument " << tr.current_token() );

                curr_token.trim_left( value_separator.size() );

                // Deduce value source
                value = curr_token;
                if( value.is_empty() ) {
                    tr.next_token();
                    value = tr.current_token();
                }

                BOOST_TEST_I_ASSRT( !value.is_empty(),
                                    format_error( found_param->p_name )
                                        << "Missing an argument value for the parameter "
                                        << found_param->p_name
                                        << " in the argument " << tr.current_token() );
            }

            // Validate against argument duplication
            BOOST_TEST_I_ASSRT( !res.has( found_param->p_name ) || found_param->p_repeatable,
                                duplicate_arg( found_param->p_name )
                                    << "Duplicate argument value for the parameter "
                                    << found_param->p_name
                                    << " in the argument " << tr.current_token() );

            // Produce argument value
            found_param->produce_argument( value, negative_form, res );

            tr.next_token();
        }

        // generate the remainder and return it's size
        return tr.remainder();
    }